

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ICheck(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  int local_5c;
  uint local_4c;
  uint local_48;
  int fVerbose;
  int fDump;
  int fBackTopo;
  int fReverse;
  int fSearch;
  int fEmpty;
  int nTimeOut;
  int nFramesMax;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fEmpty = 1;
  fSearch = 0;
  fReverse = 0;
  bVar1 = true;
  fDump = 0;
  fVerbose = 0;
  local_48 = 0;
  local_4c = 0;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"MTesrbdvh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9ICheck(): There is no AIG.\n");
        return 0;
      }
      iVar2 = Gia_ManRegNum(pAbc->pGia);
      if (iVar2 == 0) {
        Abc_Print(-1,"Abc_CommandAbc9ICheck(): The AIG is combinational.\n");
        return 0;
      }
      Vec_IntFreeP(&pAbc->vIndFlops);
      if (bVar1) {
        pVVar3 = Bmc_PerformISearch(pAbc->pGia,fEmpty,fSearch,fDump,fVerbose,local_48,local_4c);
        pAbc->vIndFlops = pVVar3;
      }
      else {
        Bmc_PerformICheck(pAbc->pGia,fEmpty,fSearch,fReverse,local_4c);
      }
      if (pAbc->vIndFlops == (Vec_Int_t *)0x0) {
        local_5c = 0;
      }
      else {
        local_5c = fEmpty;
      }
      pAbc->nIndFrames = local_5c;
      return 0;
    }
    switch(iVar2) {
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_00274ac3;
      }
      fEmpty = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fEmpty < 1) goto LAB_00274ac3;
      break;
    default:
      goto LAB_00274ac3;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_00274ac3;
      }
      fSearch = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fSearch < 0) {
LAB_00274ac3:
        Abc_Print(-2,"usage: &icheck [-MT num] [-esrbdvh]\n");
        Abc_Print(-2,"\t         performs specialized induction check\n");
        Abc_Print(-2,"\t-M num : the number of timeframes used for induction [default = %d]\n",
                  (ulong)(uint)fEmpty);
        Abc_Print(-2,"\t-T num : approximate global runtime limit in seconds [default = %d]\n",
                  (ulong)(uint)fSearch);
        pcVar4 = "no";
        if (fReverse != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-e     : toggle using empty set of next-state functions [default = %s]\n",
                  pcVar4);
        pcVar4 = "no";
        if (bVar1) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-s     : toggle searching for a minimal subset [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (fDump != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-r     : toggle searching in the reverse order [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (fVerbose != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-b     : toggle searching in backward order from POs [default = %s]\n",
                  pcVar4);
        pcVar4 = "no";
        if (local_48 != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-d     : toggle printing out the resulting set [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (local_4c != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      }
      break;
    case 0x62:
      fVerbose = fVerbose ^ 1;
      break;
    case 100:
      local_48 = local_48 ^ 1;
      break;
    case 0x65:
      fReverse = fReverse ^ 1;
      break;
    case 0x68:
      goto LAB_00274ac3;
    case 0x72:
      fDump = fDump ^ 1;
      break;
    case 0x73:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x76:
      local_4c = local_4c ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9ICheck( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, nFramesMax = 1, nTimeOut = 0, fEmpty = 0, fSearch = 1, fReverse = 0, fBackTopo = 0, fDump = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "MTesrbdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            nFramesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nFramesMax <= 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut < 0 )
                goto usage;
            break;
        case 'e':
            fEmpty ^= 1;
            break;
        case 's':
            fSearch ^= 1;
            break;
        case 'r':
            fReverse ^= 1;
            break;
        case 'b':
            fBackTopo ^= 1;
            break;
        case 'd':
            fDump ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9ICheck(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9ICheck(): The AIG is combinational.\n" );
        return 0;
    }
    Vec_IntFreeP( &pAbc->vIndFlops );
    if ( fSearch )
        pAbc->vIndFlops = Bmc_PerformISearch( pAbc->pGia, nFramesMax, nTimeOut, fReverse, fBackTopo, fDump, fVerbose );
    else
        Bmc_PerformICheck( pAbc->pGia, nFramesMax, nTimeOut, fEmpty, fVerbose );
    pAbc->nIndFrames = pAbc->vIndFlops ? nFramesMax : 0;
    return 0;

usage:
    Abc_Print( -2, "usage: &icheck [-MT num] [-esrbdvh]\n" );
    Abc_Print( -2, "\t         performs specialized induction check\n" );
    Abc_Print( -2, "\t-M num : the number of timeframes used for induction [default = %d]\n",    nFramesMax );
    Abc_Print( -2, "\t-T num : approximate global runtime limit in seconds [default = %d]\n",    nTimeOut );
    Abc_Print( -2, "\t-e     : toggle using empty set of next-state functions [default = %s]\n", fEmpty? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle searching for a minimal subset [default = %s]\n",          fSearch? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle searching in the reverse order [default = %s]\n",          fReverse? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle searching in backward order from POs [default = %s]\n",    fBackTopo? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle printing out the resulting set [default = %s]\n",          fDump? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",            fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}